

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest::RcExternMethodsInterfaceTest
          (RcExternMethodsInterfaceTest *this)

{
  __tuple_element_t<1UL,_tuple<const_CodecFactory_*,_int>_> *p_Var1;
  RcExternMethodsInterfaceTest *in_RDI;
  CodecFactory *in_stack_ffffffffffffffc8;
  EncoderTest *in_stack_ffffffffffffffd0;
  int *piVar2;
  
  testing::WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>::GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,int>
            ((tuple<const_libaom_test::CodecFactory_*,_int> *)0x138560);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  libaom_test::CodecTestWithParam<int>::CodecTestWithParam
            ((CodecTestWithParam<int> *)in_stack_ffffffffffffffd0);
  (in_RDI->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_00cb1b28;
  (in_RDI->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.super_Test._vptr_Test =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_00cb1bd0;
  (in_RDI->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__RcExternMethodsInterfaceTest_00cb1c10;
  AomAV1RateControlRtcConfig::AomAV1RateControlRtcConfig((AomAV1RateControlRtcConfig *)0x1385b7);
  piVar2 = &in_RDI->aq_mode_;
  testing::WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>::GetParam();
  p_Var1 = std::get<1ul,libaom_test::CodecFactory_const*,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_int> *)0x1385df);
  *piVar2 = *p_Var1;
  SetConfig(in_RDI);
  return;
}

Assistant:

RcExternMethodsInterfaceTest()
      : EncoderTest(GET_PARAM(0)), aq_mode_(GET_PARAM(1)) {
    SetConfig();
  }